

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

void host_end_rewind(Host *host)

{
  Emulator *e_00;
  Ticks TVar1;
  undefined1 local_40 [8];
  JoypadButtons buttons;
  Emulator *e;
  Ticks ticks;
  Host *host_local;
  
  e_00 = host_get_emulator(host);
  emulator_get_ticks(e_00);
  if ((host->rewind_state).rewinding != FALSE) {
    if ((host->rewind_state).rewind_result.info != (RewindInfo *)0x0) {
      buttons._24_8_ = host_get_emulator(host);
      rewind_truncate_to(host->rewind_buffer,(Emulator *)buttons._24_8_,
                         &(host->rewind_state).rewind_result);
      if ((host->init).joypad_filename == (char *)0x0) {
        joypad_truncate_to(host->joypad_buffer,(host->rewind_state).joypad_playback.current);
        joypad_callback((JoypadButtons *)local_40,host);
      }
      TVar1 = emulator_get_ticks((Emulator *)buttons._24_8_);
      host->last_ticks = TVar1;
    }
    memset(&host->rewind_state,0,0x58);
    return;
  }
  __assert_fail("host->rewind_state.rewinding",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x192,
                "void host_end_rewind(Host *)");
}

Assistant:

void host_end_rewind(Host* host) {
  Ticks ticks = emulator_get_ticks(host_get_emulator(host));
  assert(host->rewind_state.rewinding);

  if (host->rewind_state.rewind_result.info) {
    Emulator* e = host_get_emulator(host);
    rewind_truncate_to(host->rewind_buffer, e,
                       &host->rewind_state.rewind_result);
    if (!host->init.joypad_filename) {
      joypad_truncate_to(host->joypad_buffer,
                         host->rewind_state.joypad_playback.current);
      /* Append the current joypad state. */
      JoypadButtons buttons;
      joypad_callback(&buttons, host);
    }
    host->last_ticks = emulator_get_ticks(e);
  }

  memset(&host->rewind_state, 0, sizeof(host->rewind_state));
}